

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void amrex::DistributionMapping::strategy(Strategy how)

{
  undefined4 in_EDI;
  char *unaff_retaddr;
  
  m_Strategy = in_EDI;
  switch(in_EDI) {
  case 0:
    m_BuildMap = RoundRobinProcessorMap;
    _DAT_01aadc68 = 0;
    break;
  case 1:
    m_BuildMap = KnapSackProcessorMap;
    _DAT_01aadc68 = 0;
    break;
  case 2:
    m_BuildMap = SFCProcessorMap;
    _DAT_01aadc68 = 0;
    break;
  case 3:
    m_BuildMap = RRSFCProcessorMap;
    _DAT_01aadc68 = 0;
    break;
  default:
    Error_host(unaff_retaddr);
  }
  return;
}

Assistant:

void
DistributionMapping::strategy (DistributionMapping::Strategy how)
{
    DistributionMapping::m_Strategy = how;

    switch (how)
    {
    case ROUNDROBIN:
        m_BuildMap = &DistributionMapping::RoundRobinProcessorMap;
        break;
    case KNAPSACK:
        m_BuildMap = &DistributionMapping::KnapSackProcessorMap;
        break;
    case SFC:
        m_BuildMap = &DistributionMapping::SFCProcessorMap;
        break;
    case RRSFC:
        m_BuildMap = &DistributionMapping::RRSFCProcessorMap;
        break;
    default:
        amrex::Error("Bad DistributionMapping::Strategy");
    }
}